

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_normalizes_to_zero(secp256k1_fe *r)

{
  int iVar1;
  secp256k1_fe *in_stack_00000030;
  
  secp256k1_fe_verify(r);
  iVar1 = secp256k1_fe_impl_normalizes_to_zero(in_stack_00000030);
  return iVar1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_normalizes_to_zero(const secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    return secp256k1_fe_impl_normalizes_to_zero(r);
}